

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clause.cpp
# Opt level: O0

void __thiscall
Clasp::mt::SharedLitsClause::destroy(SharedLitsClause *this,Solver *s,bool detachFirst)

{
  bool bVar1;
  byte in_DL;
  Solver *in_RSI;
  Solver *in_RDI;
  ClauseHead *unaff_retaddr;
  void *mem;
  Solver *this_00;
  
  if (in_RSI != (Solver *)0x0) {
    if ((in_DL & 1) != 0) {
      ClauseHead::detach(unaff_retaddr,in_RDI);
    }
    bVar1 = ClauseHead::learnt((ClauseHead *)0x22f0c5);
    if (bVar1) {
      Solver::freeLearntBytes(in_RSI,0x20);
    }
  }
  SharedLiterals::release((SharedLiterals *)0x22f0e9);
  this_00 = in_RDI;
  (**(code **)(*(long *)in_RDI + 0x80))();
  if (in_RSI != (Solver *)0x0) {
    Solver::freeSmall(this_00,in_RDI);
  }
  return;
}

Assistant:

void SharedLitsClause::destroy(Solver* s, bool detachFirst) {
	if (s) {
		if (detachFirst) { ClauseHead::detach(*s); }
		if (learnt())    { s->freeLearntBytes(32); }
	}
	shared_->release();
	void* mem = this;
	this->~SharedLitsClause();
	if (s) { s->freeSmall(mem); }
}